

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  value_type puVar1;
  uchar *this_00;
  uint16_t uVar2;
  uint uVar3;
  TrieNode<unsigned_short> *this_01;
  size_type sVar4;
  const_reference ppuVar5;
  reference ppuVar6;
  reference pvVar7;
  reference ppvVar8;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_02;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_2f0;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *sub_bucket_1;
  uchar *puStack_2e0;
  unsigned_short ch_1;
  uchar *ptr;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *sub_bucket;
  uint local_2c8;
  uint uStack_2c4;
  unsigned_short ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_short,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_short> *new_node;
  size_t depth_local;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_local;
  BurstSimple<unsigned_short> *this_local;
  
  this_01 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this_01);
  sVar4 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket);
  uVar3 = (uint)sVar4;
  cache._M_elems[0x3c] = 0;
  cache._M_elems[0x3d] = 0;
  for (; (uint)cache._M_elems._120_4_ < uVar3 - (uVar3 & 0x3f);
      cache._M_elems._120_4_ = cache._M_elems._120_4_ + 0x40) {
    for (uStack_2c4 = 0; uStack_2c4 < 0x40; uStack_2c4 = uStack_2c4 + 1) {
      ppuVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)(cache._M_elems._120_4_ + uStack_2c4));
      puVar1 = *ppuVar5;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      *ppuVar6 = puVar1;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      uVar2 = get_char<unsigned_short>(*ppuVar6,depth);
      pvVar7 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_2c4);
      *pvVar7 = uVar2;
    }
    for (local_2c8 = 0; local_2c8 < 0x40; local_2c8 = local_2c8 + 1) {
      pvVar7 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_2c8);
      sub_bucket._6_2_ = *pvVar7;
      ppvVar8 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)this_01,(ulong)sub_bucket._6_2_);
      ptr = (uchar *)*ppvVar8;
      if (ptr == (uchar *)0x0) {
        this_02 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_02);
        ptr = (uchar *)this_02;
        ppvVar8 = std::array<void_*,_65536UL>::operator[]
                            ((array<void_*,_65536UL> *)this_01,(ulong)sub_bucket._6_2_);
        *ppvVar8 = this_02;
      }
      this_00 = ptr;
      ppuVar6 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_2c8);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this_00,ppuVar6);
    }
  }
  for (; (uint)cache._M_elems._120_4_ < uVar3; cache._M_elems._120_4_ = cache._M_elems._120_4_ + 1)
  {
    ppuVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        (bucket,(ulong)(uint)cache._M_elems._120_4_);
    puStack_2e0 = *ppuVar5;
    uVar2 = get_char<unsigned_short>(puStack_2e0,depth);
    ppvVar8 = std::array<void_*,_65536UL>::operator[]
                        ((array<void_*,_65536UL> *)this_01,(ulong)uVar2);
    local_2f0 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)*ppvVar8;
    if (local_2f0 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      local_2f0 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(local_2f0);
      ppvVar8 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)this_01,(ulong)uVar2);
      *ppvVar8 = local_2f0;
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (local_2f0,&stack0xfffffffffffffd20);
  }
  return this_01;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}